

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O1

void __thiscall transaction_tests::tx_invalid::test_method(tx_invalid *this)

{
  pointer pcVar1;
  string strFlags;
  bool bVar2;
  _Rb_tree_color flags;
  _Rb_tree_color _Var3;
  int iVar4;
  UniValue *pUVar5;
  UniValue *pUVar6;
  UniValue *pUVar7;
  string *psVar8;
  mapped_type *pmVar9;
  long lVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  uint64_t uVar13;
  _Base_ptr p_Var14;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  ulong index;
  uint uVar17;
  size_t index_00;
  PrecomputedTransactionData *in_R8;
  PrecomputedTransactionData *pPVar18;
  string *in_R9;
  char *pcVar19;
  long in_FS_OFFSET;
  string_view jsondata;
  string_view hex_str;
  Span<const_std::byte> sp;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  string_view str;
  DataStream stream;
  PrecomputedTransactionData txdata;
  TxValidationState state;
  CTransaction tx;
  string transaction;
  UniValue inputs;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  mapprevOutValues;
  map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
  mapprevOutScriptPubKeys;
  string strTest;
  UniValue tests;
  undefined4 in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffff9fc;
  RandomMixin<FastRandomContext> *this_00;
  char *in_stack_fffffffffffffa10;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  assertion_result local_580;
  char *local_568;
  assertion_result local_560;
  _Rb_tree_node_base *local_548;
  assertion_result local_540;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 local_4c8 [16];
  undefined ***local_4b8;
  _Alloc_hider *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  DataStream local_458;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  undefined1 local_3d8 [8];
  element_type *local_3d0;
  shared_count sStack_3c8;
  _Rb_tree_node_base *local_3c0;
  long *local_3a8 [2];
  long local_398 [2];
  undefined **local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_380;
  sp_counted_base *local_378;
  _Alloc_hider *p_Stack_370;
  int local_368;
  vector<CTxOut,_std::allocator<CTxOut>_> local_280;
  TxValidationState local_258;
  undefined1 local_208 [32];
  bool local_1e8;
  long *local_188;
  size_t local_180;
  long local_178 [2];
  undefined1 local_168 [8];
  _Alloc_hider local_160;
  shared_count sStack_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_140;
  vector<UniValue,_std::allocator<UniValue>_> local_128;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  local_110;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_CScript>,_std::_Select1st<std::pair<const_COutPoint,_CScript>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
  local_e0;
  undefined1 local_b0 [32];
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  jsondata._M_str =
       "[\n[\"The following are deserialized transactions which are invalid.\"],\n[\"They are in the form\"],\n[\"[[[prevout hash, prevout index, prevout scriptPubKey, amount?], [input 2], ...],\"],\n[\"serializedTransaction, verifyFlags]\"],\n[\"Use BADTX for verifyFlags if it is expected to fail CheckTransaction()\"],\n[\"Objects that are only a single string (like this one) are ignored\"],\n\n[\"0e1b5688cf179cd9f7cbda1fac0090f6e684bbf8cd946660120197c3f3681809 but with extra junk appended to the end of the scriptPubKey\"],\n[[[\"6ca7ec7b1847f6bdbd737176050e6a08d66ccd55bb94ad24f4018024107a5827\", 0, \"0x41 0x043b640e983c9690a14c039a2037ecc3467b27a0dcd58f19d76c7bc118d09fec45adc5370a1c5bf8067ca9f5557a4cf885fdb0fe0dcc9c3a7137226106fbc779a5 CHECKSIG VERIFY 1\"]],\n\"010000000127587a10248001f424ad94bb55cd6cd6086a0e05767173bdbdf647187beca76c000000004948304502201b822ad10d6adc1a341ae8835be3f70a25201bbff31f59cbb9c5353a5f0eca18022100ea7b2f7074e9aa9cf70aa8d0ffee13e6b45dddabf1ab961bda378bcdb778fa4701ffffffff0100f2052a010000001976a914fc50c5907d86fed474ba5ce8b12a66e0a4c139d888ac00000000\", \"NONE\"],\n\n[\"This is the nearly-standard transaction with CHECKSIGVERIFY 1 instead of CHECKSIG from tx_valid.json\"],\n[\"but with the signature duplicated in the scriptPubKey with a non-standard pushdata prefix\"],\n[\"See FindAndDelete, which will only remove if it uses the same pushdata prefix as is standard\"],\n[[[\"0000000000000000000000000000000000000000000000000000000000000100\", 0, \"DUP HASH160 0x14 0x5b6462475454710f3c22f5fdf0b40704c92f25c3 EQUALVERIFY CHECKSIGVERIFY 1 0x4c 0x47 0x3044022067288ea50aa799543a536ff9306f8e1cba05b9c6b10951175b924f96732555ed022026d7b5265f38d21541519e4a1e55044d5b9e17e15cdbaf29ae3792e99e883e7a01\"]],\n\"01000000010001000000000000000000000000000000000000000000000000000000000000000000006a473044022067288ea50aa799543a536ff9306f8e1cba05b9c6b10951175b924f96732555ed022026d7b5265f38d21541519e4a1e55044d5b9e17e15cdbaf29ae3792e99e883e7a012103ba8c8b86dea131c22ab967e6dd99bdae8eff7a1f75a2c35f1f944109e3fe5e22ffffffff010000000000000000015100000000\", \"NONE\"],\n\n[\"Same as ab..." /* TRUNCATED STRING LITERAL */
  ;
  jsondata._M_len = 0xd0a4;
  read_json(&local_90,jsondata);
  if (local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.super_RandomMixin<FastRandomContext>
    ;
    index = 0;
    do {
      pUVar5 = ::UniValue::operator[](&local_90,index);
      ::UniValue::write_abi_cxx11_((UniValue *)local_b0,(int)pUVar5,(void *)0x0,0);
      pUVar6 = ::UniValue::operator[](pUVar5,0);
      if (pUVar6->typ == VARR) {
        if ((((long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_finish -
              (long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                    .super__Vector_impl_data._M_start == 0x108) &&
            (pUVar6 = ::UniValue::operator[](pUVar5,1), pUVar6->typ == VSTR)) &&
           (pUVar6 = ::UniValue::operator[](pUVar5,2), pUVar6->typ == VSTR)) {
          local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_e0._M_impl.super__Rb_tree_header._M_header;
          local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_110._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_110._M_impl.super__Rb_tree_header._M_header;
          local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_110._M_impl.super__Rb_tree_header._M_header._M_right =
               local_110._M_impl.super__Rb_tree_header._M_header._M_left;
          local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
          pUVar6 = ::UniValue::operator[](pUVar5,0);
          pUVar6 = ::UniValue::get_array(pUVar6);
          local_168._0_4_ = pUVar6->typ;
          local_160._M_p = (pointer)&local_150;
          pcVar1 = (pUVar6->val)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,pcVar1,pcVar1 + (pUVar6->val)._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_140,&pUVar6->keys);
          std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_128,&pUVar6->values);
          if (local_128.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_128.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start) {
LAB_00674523:
            pUVar6 = ::UniValue::operator[](pUVar5,1);
            psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar6);
            local_188 = local_178;
            pcVar1 = (psVar8->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_188,pcVar1,pcVar1 + psVar8->_M_string_length);
            hex_str._M_str = (char *)local_188;
            hex_str._M_len = local_180;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_388,hex_str);
            sp.m_size = (long)paStack_380 - (long)local_388;
            sp.m_data = (byte *)local_388;
            DataStream::DataStream(&local_458,sp);
            if (local_388 != (undefined **)0x0) {
              operator_delete(local_388,(long)local_378 - (long)local_388);
            }
            CTransaction::CTransaction<DataStream>
                      ((CTransaction *)local_208,&::TX_WITH_WITNESS,&local_458);
            local_258.super_ValidationState<TxValidationResult>._0_8_ = (undefined **)0x0;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)&local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                           field_2;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0
            ;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity =
                 local_258.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                 _M_allocated_capacity & 0xffffffffffffff00;
            local_258.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                 (pointer)&local_258.super_ValidationState<TxValidationResult>.m_debug_message.
                           field_2;
            local_258.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0
            ;
            local_258.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf
            [0] = '\0';
            bVar2 = CheckTransaction((CTransaction *)local_208,&local_258);
            if (bVar2 && local_258.super_ValidationState<TxValidationResult>.m_mode != M_INVALID) {
              PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>
                        ((PrecomputedTransactionData *)&local_388,(CTransaction *)local_208);
              pUVar5 = ::UniValue::operator[](pUVar5,2);
              psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar5);
              local_3a8[0] = local_398;
              pcVar1 = (psVar8->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3a8,pcVar1,pcVar1 + psVar8->_M_string_length);
              strFlags._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff9fc;
              strFlags._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff9f8;
              strFlags._M_string_length = (size_type)this_00;
              strFlags.field_2._M_allocated_capacity = index;
              strFlags.field_2._8_8_ = in_stack_fffffffffffffa10;
              flags = ParseScriptFlags(strFlags);
              if (local_3a8[0] != local_398) {
                operator_delete(local_3a8[0],local_398[0] + 1);
              }
              _Var3 = FillFlags(flags);
              if (flags != _Var3) {
                local_498 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_490 = "";
                local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
                local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
                file.m_end = (iterator)0x157;
                file.m_begin = (iterator)&local_498;
                msg.m_end = (iterator)in_R9;
                msg.m_begin = (iterator)in_R8;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
                           (size_t)&local_4a8,msg);
                local_560._0_8_ = local_560._0_8_ & 0xffffffffffffff00;
                local_560.m_message.px = (element_type *)0x0;
                local_560.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_4c8[8] = false;
                local_4c8._0_8_ = &PTR__lazy_ostream_013b0930;
                local_4b8 = (undefined ***)boost::unit_test::lazy_ostream::inst;
                local_4b0 = (_Alloc_hider *)0xf420fd;
                local_3d0 = (element_type *)((ulong)local_3d0 & 0xffffffffffffff00);
                local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013b0970;
                sStack_3c8.pi_ = (sp_counted_base *)local_4c8;
                local_3c0 = (_Rb_tree_node_base *)local_b0;
                local_4d8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_4d0 = "";
                in_R8 = (PrecomputedTransactionData *)0x1;
                in_R9 = (string *)0x1;
                boost::test_tools::tt_detail::report_assertion
                          (&local_560,(lazy_ostream *)local_3d8,1,1,WARN,(check_type)this_00,
                           (size_t)&local_4d8,0x157);
                boost::detail::shared_count::~shared_count(&local_560.m_message.pn);
              }
              local_4e8 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_4e0 = "";
              local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
              local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
              file_00.m_end = (iterator)0x15c;
              file_00.m_begin = (iterator)&local_4e8;
              msg_00.m_end = (iterator)in_R9;
              msg_00.m_begin = (iterator)in_R8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                         (size_t)&local_4f8,msg_00);
              bVar2 = CheckTxScripts((CTransaction *)local_208,
                                     (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                      *)&local_e0,
                                     (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                      *)&local_110,flags,(PrecomputedTransactionData *)&local_388,
                                     (string *)local_b0,false);
              local_560.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)(readonly_property<bool>)bVar2;
              local_560.m_message.px = (element_type *)0x0;
              local_560.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_4c8[8] = false;
              local_4c8._0_8_ = &PTR__lazy_ostream_013ab780;
              local_4b8 = (undefined ***)boost::unit_test::lazy_ostream::inst;
              local_4b0 = (_Alloc_hider *)0xf4219b;
              local_3d0 = (element_type *)((ulong)local_3d0 & 0xffffffffffffff00);
              local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013b09b0;
              sStack_3c8.pi_ = (sp_counted_base *)local_4c8;
              local_508 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_500 = "";
              in_stack_fffffffffffff9f8 = 0;
              in_stack_fffffffffffff9fc = 0;
              in_R8 = (PrecomputedTransactionData *)0x1;
              in_R9 = (string *)0x1;
              local_3c0 = (_Rb_tree_node_base *)local_b0;
              boost::test_tools::tt_detail::report_assertion
                        (&local_560,(lazy_ostream *)local_3d8,1,1,WARN,(check_type)this_00,
                         (size_t)&local_508,0x15c);
              boost::detail::shared_count::~shared_count(&local_560.m_message.pn);
              for (p_Var14 = mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                             _M_left;
                  (_Rb_tree_header *)p_Var14 !=
                  &mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
                  p_Var14 = (_Base_ptr)std::_Rb_tree_increment(p_Var14)) {
                uVar17 = FillFlags(p_Var14[2]._M_color | flags);
                psVar8 = (string *)local_b0;
                pPVar18 = (PrecomputedTransactionData *)&local_388;
                bVar2 = CheckTxScripts((CTransaction *)local_208,
                                       (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                        *)&local_e0,
                                       (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                        *)&local_110,uVar17,(PrecomputedTransactionData *)&local_388
                                       ,psVar8,false);
                if (!bVar2) {
                  local_518 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_510 = "";
                  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_01.m_end = (iterator)0x163;
                  file_01.m_begin = (iterator)&local_518;
                  msg_01.m_end = (iterator)psVar8;
                  msg_01.m_begin = (iterator)pPVar18;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                             (size_t)&local_528,msg_01);
                  local_540.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)(class_property<bool>)0x0;
                  local_540.m_message.px = (element_type *)0x0;
                  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_580.m_message.px =
                       (element_type *)((ulong)local_580.m_message.px & 0xffffffffffffff00);
                  local_580._0_8_ = &PTR__lazy_ostream_013ae308;
                  local_580.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_568 = "Tx unexpectedly passed with flag ";
                  local_560.m_message.px =
                       (element_type *)((ulong)local_560.m_message.px & 0xffffffffffffff00);
                  local_560._0_8_ = &PTR__lazy_ostream_013b09f0;
                  local_560.m_message.pn.pi_ = (sp_counted_base *)&local_580;
                  local_4c8[8] = false;
                  local_4c8._0_8_ = &PTR__lazy_ostream_013b0b70;
                  local_4b8 = (undefined ***)&local_560;
                  local_4b0 = (_Alloc_hider *)0xf4220e;
                  local_3d0 = (element_type *)((ulong)local_3d0 & 0xffffffffffffff00);
                  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013b0bb0;
                  sStack_3c8.pi_ = (sp_counted_base *)local_4c8;
                  local_3c0 = (_Rb_tree_node_base *)local_b0;
                  local_590 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_588 = "";
                  in_stack_fffffffffffff9fc = 0;
                  local_548 = p_Var14 + 1;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_540,(lazy_ostream *)local_3d8,1,1,WARN,(check_type)this_00,
                             (size_t)&local_590,0x163);
                  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
                }
                uVar13 = RandomMixin<FastRandomContext>::randbits
                                   (this_00,(int)mapFlagNames_abi_cxx11_._M_t._M_impl.
                                                 super__Rb_tree_header._M_node_count);
                uVar17 = FillFlags((_Rb_tree_color)uVar13 | flags);
                in_stack_fffffffffffff9f8 = 0;
                in_R9 = (string *)local_b0;
                in_R8 = (PrecomputedTransactionData *)&local_388;
                bVar2 = CheckTxScripts((CTransaction *)local_208,
                                       (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                        *)&local_e0,
                                       (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                        *)&local_110,uVar17,(PrecomputedTransactionData *)&local_388
                                       ,in_R9,false);
                if (!bVar2) {
                  local_5a0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_598 = "";
                  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
                  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
                  file_02.m_end = (iterator)0x168;
                  file_02.m_begin = (iterator)&local_5a0;
                  msg_02.m_end = (iterator)in_R9;
                  msg_02.m_begin = (iterator)in_R8;
                  boost::unit_test::unit_test_log_t::set_checkpoint
                            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                             (size_t)&local_5b0,msg_02);
                  local_560.m_message.px =
                       (element_type *)((ulong)local_560.m_message.px & 0xffffffffffffff00);
                  local_560._0_8_ = &PTR__lazy_ostream_013b0ab0;
                  local_560.m_message.pn.pi_ = (sp_counted_base *)&local_580;
                  local_540.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)(class_property<bool>)0x0;
                  local_540.m_message.px = (element_type *)0x0;
                  local_540.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_580.m_message.px =
                       (element_type *)((ulong)local_580.m_message.px & 0xffffffffffffff00);
                  local_580._0_8_ = &PTR__lazy_ostream_013ab518;
                  local_580.m_message.pn.pi_ =
                       (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  local_568 = "Tx unexpectedly passed with random flags ";
                  local_4c8[8] = false;
                  local_4c8._0_8_ = &PTR__lazy_ostream_013b0af0;
                  local_4b8 = (undefined ***)&local_560;
                  local_4b0 = (_Alloc_hider *)0xe4ec99;
                  local_3d0 = (element_type *)((ulong)local_3d0 & 0xffffffffffffff00);
                  local_3d8 = (undefined1  [8])&PTR__lazy_ostream_013b0b30;
                  sStack_3c8.pi_ = (sp_counted_base *)local_4c8;
                  local_3c0 = (_Rb_tree_node_base *)local_b0;
                  local_5c0 = 
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                  ;
                  local_5b8 = "";
                  in_stack_fffffffffffff9f8 = 0;
                  in_stack_fffffffffffff9fc = 0;
                  in_R8 = (PrecomputedTransactionData *)0x1;
                  in_R9 = (string *)0x1;
                  local_548 = p_Var14 + 1;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_540,(lazy_ostream *)local_3d8,1,1,WARN,(check_type)this_00,
                             (size_t)&local_5c0,0x168);
                  boost::detail::shared_count::~shared_count(&local_540.m_message.pn);
                }
              }
              ExcludeIndividualFlags
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_3d8,flags);
              p_Var15 = local_3c0;
              if (local_3c0 != (_Rb_tree_node_base *)&local_3d0) {
                do {
                  in_stack_fffffffffffff9f8 = 1;
                  in_R9 = (string *)local_b0;
                  in_R8 = (PrecomputedTransactionData *)&local_388;
                  bVar2 = CheckTxScripts((CTransaction *)local_208,
                                         (map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                          *)&local_e0,
                                         (map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                          *)&local_110,p_Var15[1]._M_color,
                                         (PrecomputedTransactionData *)&local_388,in_R9,true);
                  if (!bVar2) {
                    local_5d0 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                    ;
                    local_5c8 = "";
                    local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
                    file_05.m_end = (iterator)0x16f;
                    file_05.m_begin = (iterator)&local_5d0;
                    msg_05.m_end = (iterator)in_R9;
                    msg_05.m_begin = (iterator)in_R8;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                               (size_t)&local_5e0,msg_05);
                    local_580._0_8_ = local_580._0_8_ & 0xffffffffffffff00;
                    local_580.m_message.px = (element_type *)0x0;
                    local_580.m_message.pn.pi_ = (sp_counted_base *)0x0;
                    local_560.m_message.px =
                         (element_type *)((ulong)local_560.m_message.px & 0xffffffffffffff00);
                    local_560._0_8_ = &PTR__lazy_ostream_013adba8;
                    local_560.m_message.pn.pi_ =
                         (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                    local_548 = (_Rb_tree_node_base *)0xf42200;
                    local_4c8[8] = false;
                    local_4c8._0_8_ = &PTR__lazy_ostream_013adb68;
                    local_4b8 = (undefined ***)&local_560;
                    local_4b0 = (_Alloc_hider *)local_b0;
                    in_stack_fffffffffffffa10 =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
                    ;
                    in_stack_fffffffffffff9f8 = 0;
                    in_stack_fffffffffffff9fc = 0;
                    in_R8 = (PrecomputedTransactionData *)0x1;
                    in_R9 = (string *)0x1;
                    boost::test_tools::tt_detail::report_assertion
                              (&local_580,(lazy_ostream *)local_4c8,1,1,WARN,(check_type)this_00,
                               (size_t)&stack0xfffffffffffffa10,0x16f);
                    boost::detail::shared_count::~shared_count(&local_580.m_message.pn);
                  }
                  p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
                } while (p_Var15 != (_Rb_tree_node_base *)&local_3d0);
              }
              std::
              _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
              ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                           *)local_3d8);
              std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_280);
            }
            else {
              local_468 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_460 = "";
              local_478 = &boost::unit_test::basic_cstring<char_const>::null;
              local_470 = &boost::unit_test::basic_cstring<char_const>::null;
              file_04.m_end = (iterator)0x14e;
              file_04.m_begin = (iterator)&local_468;
              msg_04.m_end = (iterator)in_R9;
              msg_04.m_begin = (iterator)in_R8;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                         (size_t)&local_478,msg_04);
              pUVar5 = ::UniValue::operator[](pUVar5,2);
              psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar5);
              iVar4 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (psVar8,"BADTX");
              local_3d8[0] = iVar4 == 0;
              local_3d0 = (element_type *)0x0;
              sStack_3c8.pi_ = (sp_counted_base *)0x0;
              paStack_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)((ulong)paStack_380 & 0xffffffffffffff00);
              local_388 = &PTR__lazy_ostream_013aba30;
              local_378 = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              p_Stack_370 = (_Alloc_hider *)local_b0;
              local_488 = 
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_480 = "";
              in_stack_fffffffffffff9f8 = 0;
              in_stack_fffffffffffff9fc = 0;
              in_R8 = (PrecomputedTransactionData *)0x1;
              in_R9 = (string *)0x1;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)local_3d8,(lazy_ostream *)&local_388,1,1,WARN,
                         (check_type)this_00,(size_t)&local_488,0x14e);
              boost::detail::shared_count::~shared_count(&sStack_3c8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
                   _M_p !=
                &local_258.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
              operator_delete(local_258.super_ValidationState<TxValidationResult>.m_debug_message.
                              _M_dataplus._M_p,
                              CONCAT71(local_258.super_ValidationState<TxValidationResult>.
                                       m_debug_message.field_2._M_allocated_capacity._1_7_,
                                       local_258.super_ValidationState<TxValidationResult>.
                                       m_debug_message.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                   _M_p !=
                &local_258.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
              operator_delete(local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                              _M_dataplus._M_p,
                              (ulong)(local_258.super_ValidationState<TxValidationResult>.
                                      m_reject_reason.field_2._M_allocated_capacity + 1));
            }
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_208 + 0x18));
            std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                      ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_208);
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_458)
            ;
            if (local_188 != local_178) {
              operator_delete(local_188,local_178[0] + 1);
            }
          }
          else {
            uVar17 = 1;
            index_00 = 0;
            pcVar19 = (char *)0x1;
            do {
              pUVar6 = ::UniValue::operator[]((UniValue *)local_168,index_00);
              bVar2 = false;
              pcVar16 = (char *)0x0;
              if (pUVar6->typ == VARR) {
                pUVar6 = ::UniValue::get_array(pUVar6);
                pcVar16 = (char *)0x0;
                bVar2 = false;
                if (0xfffffffffffffffd <
                    ((long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pUVar6->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - 5U)
                {
                  pUVar7 = ::UniValue::operator[](pUVar6,0);
                  psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar7);
                  str._M_str = pcVar16;
                  str._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
                  detail::FromHex<uint256>
                            ((optional<uint256> *)local_208,(detail *)psVar8->_M_string_length,str);
                  if (local_1e8 != true) {
                    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                      std::__throw_bad_optional_access();
                    }
                    goto LAB_006756c4;
                  }
                  local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
                  _M_p = (pointer)CONCAT44(local_208._12_4_,local_208._8_4_);
                  local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                  _M_string_length = CONCAT44(local_208._20_4_,local_208._16_4_);
                  local_258.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                  _M_allocated_capacity = CONCAT44(local_208._28_4_,local_208._24_4_);
                  local_258.super_ValidationState<TxValidationResult>.m_mode = local_208._0_4_;
                  local_258.super_ValidationState<TxValidationResult>.m_result = local_208._4_4_;
                  pUVar7 = ::UniValue::operator[](pUVar6,1);
                  local_368 = ::UniValue::getInt<int>(pUVar7);
                  local_378 = (sp_counted_base *)
                              local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                              _M_string_length;
                  p_Stack_370 = (_Alloc_hider *)
                                local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                                field_2._M_allocated_capacity;
                  local_388 = (undefined **)
                              local_258.super_ValidationState<TxValidationResult>._0_8_;
                  paStack_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_258.super_ValidationState<TxValidationResult>.
                                   m_reject_reason._M_dataplus._M_p;
                  pUVar7 = ::UniValue::operator[](pUVar6,2);
                  psVar8 = ::UniValue::get_str_abi_cxx11_(pUVar7);
                  ::ParseScript((CScript *)local_208,psVar8);
                  pmVar9 = std::
                           map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                           ::operator[]((map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                                         *)&local_e0,(key_type *)&local_388);
                  if (0x1c < (pmVar9->super_CScriptBase)._size) {
                    free((pmVar9->super_CScriptBase)._union.indirect_contents.indirect);
                  }
                  *(ulong *)((long)&(pmVar9->super_CScriptBase)._union + 0xc) =
                       CONCAT44(local_208._16_4_,local_208._12_4_);
                  *(ulong *)((long)&(pmVar9->super_CScriptBase)._union + 0x14) =
                       CONCAT44(local_208._24_4_,local_208._20_4_);
                  (pmVar9->super_CScriptBase)._union.indirect_contents.indirect =
                       (char *)local_208._0_8_;
                  *(ulong *)((long)&(pmVar9->super_CScriptBase)._union + 8) =
                       CONCAT44(local_208._12_4_,local_208._8_4_);
                  (pmVar9->super_CScriptBase)._size = local_208._28_4_;
                  if (3 < (ulong)(((long)(pUVar6->values).
                                         super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pUVar6->values).
                                         super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 3) *
                                 0x2e8ba2e8ba2e8ba3)) {
                    pUVar6 = ::UniValue::operator[](pUVar6,3);
                    lVar10 = ::UniValue::getInt<long>(pUVar6);
                    pmVar11 = std::
                              map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                              ::operator[]((map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                                            *)&local_110,(key_type *)&local_388);
                    *pmVar11 = lVar10;
                  }
                  bVar2 = true;
                  pcVar16 = pcVar19;
                }
              }
              if (!bVar2) break;
              index_00 = (size_t)uVar17;
              uVar12 = ((long)local_128.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_128.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
              uVar17 = uVar17 + 1;
              pcVar19 = pcVar16;
            } while (index_00 <= uVar12 && uVar12 - index_00 != 0);
            if (pcVar16 != (char *)0x0) goto LAB_00674523;
            local_418 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_410 = "";
            local_428 = &boost::unit_test::basic_cstring<char_const>::null;
            local_420 = &boost::unit_test::basic_cstring<char_const>::null;
            file_06.m_end = (iterator)0x144;
            file_06.m_begin = (iterator)&local_418;
            msg_06.m_end = (iterator)in_R9;
            msg_06.m_begin = (iterator)in_R8;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                       (size_t)&local_428,msg_06);
            local_258.super_ValidationState<TxValidationResult>._0_8_ =
                 local_258.super_ValidationState<TxValidationResult>._0_8_ & 0xffffffffffffff00;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)0x0;
            local_258.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0
            ;
            local_208._8_4_ = local_208._8_4_ & 0xffffff00;
            local_208._0_8_ = &PTR__lazy_ostream_013ab680;
            local_208._16_4_ = 0x13c0138;
            local_208._20_4_ = 0;
            local_208._24_4_ = 0xe5be19;
            local_208._28_4_ = 0;
            paStack_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)((ulong)paStack_380 & 0xffffffffffffff00);
            local_388 = &PTR__lazy_ostream_013ab6c0;
            local_378 = (sp_counted_base *)local_208;
            p_Stack_370 = (_Alloc_hider *)local_b0;
            local_438 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_430 = "";
            in_stack_fffffffffffff9f8 = 0;
            in_stack_fffffffffffff9fc = 0;
            in_R8 = (PrecomputedTransactionData *)0x1;
            in_R9 = (string *)0x1;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)&local_258,(lazy_ostream *)&local_388,1,1,WARN,
                       (check_type)this_00,(size_t)&local_438,0x144);
            boost::detail::shared_count::~shared_count
                      ((shared_count *)
                       &local_258.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_string_length);
          }
          std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_p != &local_150) {
            operator_delete(local_160._M_p,local_150._M_allocated_capacity + 1);
          }
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
          ::~_Rb_tree(&local_110);
          std::
          _Rb_tree<COutPoint,_std::pair<const_COutPoint,_CScript>,_std::_Select1st<std::pair<const_COutPoint,_CScript>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
          ::~_Rb_tree(&local_e0);
        }
        else {
          local_3e8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
          ;
          local_3e0 = "";
          local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_03.m_end = (iterator)0x127;
          file_03.m_begin = (iterator)&local_3e8;
          msg_03.m_end = (iterator)in_R9;
          msg_03.m_begin = (iterator)in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                     (size_t)&local_3f8,msg_03);
          local_168._0_4_ = local_168._0_4_ & 0xffffff00;
          local_160._M_p = (pointer)0x0;
          sStack_158.pi_ = (sp_counted_base *)0x0;
          local_208._8_4_ = local_208._8_4_ & 0xffffff00;
          local_208._0_8_ = &PTR__lazy_ostream_013ab680;
          local_208._16_4_ = 0x13c0138;
          local_208._20_4_ = 0;
          local_208._24_4_ = 0xe5be19;
          local_208._28_4_ = 0;
          paStack_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)((ulong)paStack_380 & 0xffffffffffffff00);
          local_388 = &PTR__lazy_ostream_013ab6c0;
          p_Stack_370 = (_Alloc_hider *)local_b0;
          local_408 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/transaction_tests.cpp"
          ;
          local_400 = "";
          in_stack_fffffffffffff9f8 = 0;
          in_stack_fffffffffffff9fc = 0;
          in_R8 = (PrecomputedTransactionData *)0x1;
          in_R9 = (string *)0x1;
          local_378 = (sp_counted_base *)local_208;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_168,(lazy_ostream *)&local_388,1,1,WARN,
                     (check_type)this_00,(size_t)&local_408,0x127);
          boost::detail::shared_count::~shared_count(&sStack_158);
        }
      }
      if ((_Alloc_hider *)local_b0._0_8_ != (_Alloc_hider *)(local_b0 + 0x10)) {
        operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
      }
      index = (ulong)((int)index + 1);
      uVar12 = ((long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
    } while (index <= uVar12 && uVar12 - index != 0);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != &local_90.val.field_2) {
    operator_delete(local_90.val._M_dataplus._M_p,local_90.val.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_006756c4:
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_invalid)
{
    // Read tests from test/data/tx_invalid.json
    UniValue tests = read_json(json_tests::tx_invalid);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test[0].isArray())
        {
            if (test.size() != 3 || !test[1].isStr() || !test[2].isStr())
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::map<COutPoint, CScript> mapprevOutScriptPubKeys;
            std::map<COutPoint, int64_t> mapprevOutValues;
            UniValue inputs = test[0].get_array();
            bool fValid = true;
            for (unsigned int inpIdx = 0; inpIdx < inputs.size(); inpIdx++) {
                const UniValue& input = inputs[inpIdx];
                if (!input.isArray()) {
                    fValid = false;
                    break;
                }
                const UniValue& vinput = input.get_array();
                if (vinput.size() < 3 || vinput.size() > 4)
                {
                    fValid = false;
                    break;
                }
                COutPoint outpoint{Txid::FromHex(vinput[0].get_str()).value(), uint32_t(vinput[1].getInt<int>())};
                mapprevOutScriptPubKeys[outpoint] = ParseScript(vinput[2].get_str());
                if (vinput.size() >= 4)
                {
                    mapprevOutValues[outpoint] = vinput[3].getInt<int64_t>();
                }
            }
            if (!fValid)
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::string transaction = test[1].get_str();
            DataStream stream(ParseHex(transaction));
            CTransaction tx(deserialize, TX_WITH_WITNESS, stream);

            TxValidationState state;
            if (!CheckTransaction(tx, state) || state.IsInvalid()) {
                BOOST_CHECK_MESSAGE(test[2].get_str() == "BADTX", strTest);
                continue;
            }

            PrecomputedTransactionData txdata(tx);
            unsigned int verify_flags = ParseScriptFlags(test[2].get_str());

            // Check that the test gives a valid combination of flags (otherwise VerifyScript will throw). Don't edit the flags.
            if (verify_flags != FillFlags(verify_flags)) {
                BOOST_ERROR("Bad test flags: " << strTest);
            }

            // Not using FillFlags() in the main test, in order to detect invalid verifyFlags combination
            BOOST_CHECK_MESSAGE(CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, verify_flags, txdata, strTest, /*expect_valid=*/false),
                                "Tx unexpectedly passed: " << strTest);

            // Backwards compatibility of script verification flags: Adding any flag(s) should not validate an invalid transaction
            for (const auto& [name, flag] : mapFlagNames) {
                unsigned int flags = FillFlags(verify_flags | flag);
                // Adding individual flags
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/false)) {
                    BOOST_ERROR("Tx unexpectedly passed with flag " << name << " set: " << strTest);
                }
                // Adding random combinations of flags
                flags = FillFlags(verify_flags | (unsigned int)m_rng.randbits(mapFlagNames.size()));
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/false)) {
                    BOOST_ERROR("Tx unexpectedly passed with random flags " << name << ": " << strTest);
                }
            }

            // Check that flags are minimal: transaction should succeed if any set flags are unset.
            for (auto flags_excluding_one : ExcludeIndividualFlags(verify_flags)) {
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags_excluding_one, txdata, strTest, /*expect_valid=*/true)) {
                    BOOST_ERROR("Too many flags set: " << strTest);
                }
            }
        }
    }
}